

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
anurbs::NurbsSurfaceGeometry<2L>::nonzero_pole_indices_at_span
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          NurbsSurfaceGeometry<2L> *this,Index span_u,Index span_v)

{
  long index_u;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Index IVar3;
  Index i;
  long lVar4;
  Index *pIVar5;
  Index j;
  long lVar6;
  allocator_type local_41;
  Index local_40;
  vector<long,_std::allocator<long>_> *local_38;
  
  local_40 = span_u;
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  std::vector<long,_std::allocator<long>_>::vector
            (__return_storage_ptr__,
             (CONCAT44(extraout_var_00,iVar2) + 1) * (CONCAT44(extraout_var,iVar1) + 1),&local_41);
  local_38 = __return_storage_ptr__;
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  pIVar5 = (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = (local_40 - CONCAT44(extraout_var_01,iVar1)) + 1;
  lVar4 = 0;
  while( true ) {
    iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
    if (CONCAT44(extraout_var_03,iVar1) < lVar4) break;
    index_u = local_40 + lVar4;
    lVar6 = 0;
    while( true ) {
      iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
      if (CONCAT44(extraout_var_04,iVar1) < lVar6) break;
      IVar3 = to_single_index(this,index_u,(span_v - CONCAT44(extraout_var_02,iVar2)) + 1 + lVar6);
      *pIVar5 = IVar3;
      pIVar5 = pIVar5 + 1;
      lVar6 = lVar6 + 1;
    }
    lVar4 = lVar4 + 1;
  }
  return local_38;
}

Assistant:

std::vector<Index> nonzero_pole_indices_at_span(const Index span_u, const Index span_v) const
    {
        std::vector<Index> indices((degree_u() + 1) * (degree_v() + 1));

        const Index first_nonzero_pole_index_u = span_u - degree_u() + 1;
        const Index first_nonzero_pole_index_v = span_v - degree_v() + 1;

        auto it = indices.begin();

        for (Index i = 0; i < degree_u() + 1; i++) {
            for (Index j = 0; j < degree_v() + 1; j++) {
                *(it++) = to_single_index(first_nonzero_pole_index_u + i, first_nonzero_pole_index_v + j);
            }
        }

        return indices;
    }